

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O2

void FT_Library_Version(FT_Library library,FT_Int *amajor,FT_Int *aminor,FT_Int *apatch)

{
  FT_Int FVar1;
  FT_Int FVar2;
  FT_Int FVar3;
  
  if (library == (FT_Library)0x0) {
    FVar3 = 0;
    FVar2 = 0;
    FVar1 = 0;
  }
  else {
    FVar3 = library->version_major;
    FVar2 = library->version_minor;
    FVar1 = library->version_patch;
  }
  if (amajor != (FT_Int *)0x0) {
    *amajor = FVar3;
  }
  if (aminor != (FT_Int *)0x0) {
    *aminor = FVar2;
  }
  if (apatch != (FT_Int *)0x0) {
    *apatch = FVar1;
  }
  return;
}

Assistant:

FT_EXPORT_DEF( void )
  FT_Library_Version( FT_Library   library,
                      FT_Int      *amajor,
                      FT_Int      *aminor,
                      FT_Int      *apatch )
  {
    FT_Int  major = 0;
    FT_Int  minor = 0;
    FT_Int  patch = 0;


    if ( library )
    {
      major = library->version_major;
      minor = library->version_minor;
      patch = library->version_patch;
    }

    if ( amajor )
      *amajor = major;

    if ( aminor )
      *aminor = minor;

    if ( apatch )
      *apatch = patch;
  }